

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

bool UTF_uc16_to_uc32(UTF_UC16 *uc16,UTF_UC32 *uc32)

{
  bool bVar1;
  UTF_UC32 *uc32_local;
  UTF_UC16 *uc16_local;
  
  bVar1 = UTF_uc16_is_surrogate_high(*uc16);
  if (bVar1) {
    bVar1 = UTF_uc16_is_surrogate_low(uc16[1]);
    if (bVar1) {
      *uc32 = ((ushort)*uc16 - 0xd800) * 0x400 + (ushort)uc16[1] + 0x2400;
      uc16_local._7_1_ = true;
    }
    else if (uc16[1] == L'\0') {
      *uc32 = (uint)(ushort)*uc16;
      uc16_local._7_1_ = true;
    }
    else {
      uc16_local._7_1_ = false;
    }
  }
  else {
    bVar1 = UTF_uc16_is_surrogate_low(*uc16);
    if (bVar1) {
      if (uc16[1] == L'\0') {
        *uc32 = (uint)(ushort)*uc16;
        uc16_local._7_1_ = true;
      }
      else {
        uc16_local._7_1_ = false;
      }
    }
    else {
      *uc32 = (uint)(ushort)*uc16;
      uc16_local._7_1_ = true;
    }
  }
  return uc16_local._7_1_;
}

Assistant:

static __inline bool
UTF_uc16_to_uc32(const UTF_UC16 uc16[4], UTF_UC32 *uc32)
{
    if (UTF_uc16_is_surrogate_high(uc16[0]))
    {
        if (UTF_uc16_is_surrogate_low(uc16[1]))
        {
            *uc32 = 0x10000 + (UTF_STATIC_CAST(UTF_UC32, uc16[0]) - 0xD800) * 0x400 +
                    (UTF_STATIC_CAST(UTF_UC32, uc16[1]) - 0xDC00);
            return true;
        }
        else if (uc16[1] == 0)
        {
            *uc32 = uc16[0];
            return true;
        }
        return false;
    }
    else if (UTF_uc16_is_surrogate_low(uc16[0]))
    {
        if (uc16[1] != 0)
            return false;

        *uc32 = uc16[0];
        return true;
    }
    else
    {
        *uc32 = uc16[0];
        return true;
    }
}